

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O2

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  int *piVar1;
  short sVar2;
  short sVar3;
  uint _c;
  int iVar4;
  uint _c_00;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  int iVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  short asVar18 [4];
  size_t sVar19;
  short asVar20 [4];
  short asVar21 [4];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int j;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  int i_1;
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  int i;
  int iVar37;
  int n;
  int iVar38;
  long lVar39;
  undefined8 *puVar40;
  int iVar41;
  ulong uVar42;
  undefined8 *puVar43;
  int iVar44;
  int iVar45;
  ulong uVar46;
  void *pvVar47;
  int iVar48;
  void *pvVar49;
  int iVar50;
  long lVar51;
  int iVar52;
  long local_5c0;
  Mat bottom_blob_tm;
  long local_578;
  short w0 [4];
  int d3_1 [2];
  Mat top_blob_tm;
  Mat top_blob_bordered;
  long local_450;
  long local_428;
  long local_420;
  short d3 [4];
  undefined8 uStack_410;
  short d2 [4];
  size_t local_3c0;
  int local_3a4;
  int local_300;
  short t1 [4];
  int iStack_2f0;
  int iStack_2ec;
  short t0 [4];
  int local_2b0;
  int local_2ac;
  size_t local_2a8;
  int local_28c;
  short t3 [4];
  undefined8 uStack_270;
  short t2 [4];
  undefined8 uStack_230;
  short w3 [4];
  size_t local_1e8;
  int local_1cc;
  short w2 [4];
  size_t local_1a8;
  int local_18c;
  short w1 [4];
  size_t local_168;
  int local_14c;
  int o1 [2];
  int o0 [2];
  Mat bottom_blob_bordered;
  int sum3 [16];
  Option opt_b;
  
  _c = bottom_blob->c;
  lVar51 = (long)(int)_c;
  iVar4 = top_blob->w;
  iVar25 = top_blob->h;
  _c_00 = top_blob->c;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar5 = (iVar4 + 1) / 2;
  uVar46 = (long)(iVar25 + 1) / 2;
  iVar4 = (int)uVar46;
  iVar32 = iVar5 * 2 + 2;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.blob_allocator = opt->workspace_allocator;
  copy_make_border(bottom_blob,&bottom_blob_bordered,0,(iVar4 * 2 - bottom_blob->h) + 2,0,
                   iVar32 - bottom_blob->w,0,0.0,&opt_b);
  bottom_blob_tm.elemsize = 0;
  bottom_blob_tm.elempack = 0;
  bottom_blob_tm.data = (void *)0x0;
  bottom_blob_tm.refcount._0_4_ = 0;
  bottom_blob_tm.refcount._4_4_ = 0;
  bottom_blob_tm.allocator = (Allocator *)0x0;
  bottom_blob_tm.dims = 0;
  bottom_blob_tm.w = 0;
  bottom_blob_tm.h = 0;
  bottom_blob_tm.c = 0;
  bottom_blob_tm.cstep = 0;
  iVar48 = iVar4 * iVar5;
  Mat::create(&bottom_blob_tm,0x10,iVar48,_c,2,opt->workspace_allocator);
  lVar31 = (long)iVar32;
  uVar30 = 0;
  iVar25 = 0;
  if (0 < iVar5) {
    iVar25 = iVar5;
  }
  uVar46 = uVar46 & 0xffffffff;
  if (iVar4 < 1) {
    uVar46 = uVar30;
  }
  uVar26 = 0;
  if (0 < (int)_c) {
    uVar26 = (ulong)_c;
  }
  for (; uVar30 != uVar26; uVar30 = uVar30 + 1) {
    pvVar47 = (void *)(bottom_blob_bordered.cstep * uVar30 * bottom_blob_bordered.elemsize +
                      (long)bottom_blob_bordered.data);
    top_blob_tm.refcount._0_4_ = 0;
    top_blob_tm.refcount._4_4_ = 0;
    top_blob_tm.elemsize = bottom_blob_bordered.elemsize;
    top_blob_tm.elempack = bottom_blob_bordered.elempack;
    top_blob_tm.dims = 2;
    top_blob_tm.allocator = bottom_blob_bordered.allocator;
    top_blob_tm.w = bottom_blob_bordered.w;
    top_blob_tm.c = 1;
    top_blob_tm.h = bottom_blob_bordered.h;
    top_blob_tm.cstep = (long)(bottom_blob_bordered.h * bottom_blob_bordered.w);
    top_blob_tm.data = pvVar47;
    Mat::~Mat(&top_blob_tm);
    pvVar49 = (void *)(bottom_blob_tm.cstep * uVar30 * bottom_blob_tm.elemsize +
                      (long)bottom_blob_tm.data);
    top_blob_tm.refcount._0_4_ = 0;
    top_blob_tm.refcount._4_4_ = 0;
    top_blob_tm.elemsize = bottom_blob_tm.elemsize;
    top_blob_tm.elempack = bottom_blob_tm.elempack;
    top_blob_tm.dims = 2;
    top_blob_tm.allocator = bottom_blob_tm.allocator;
    top_blob_tm.w = bottom_blob_tm.w;
    top_blob_tm.c = 1;
    top_blob_tm.h = bottom_blob_tm.h;
    top_blob_tm.cstep = (long)(bottom_blob_tm.h * bottom_blob_tm.w);
    top_blob_tm.data = pvVar49;
    Mat::~Mat(&top_blob_tm);
    for (uVar27 = 0; uVar27 != uVar46; uVar27 = uVar27 + 1) {
      lVar28 = (long)(iVar32 * 2 * (int)uVar27) + (long)pvVar47;
      lVar29 = lVar28 + lVar31;
      lVar35 = lVar29 + lVar31;
      lVar36 = lVar35 + lVar31;
      for (iVar37 = 0; iVar37 != iVar25; iVar37 = iVar37 + 1) {
        for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
          *(short *)((long)&top_blob_tm.data + lVar39 * 2) = (short)*(char *)(lVar28 + lVar39);
          *(short *)((long)&top_blob_bordered.data + lVar39 * 2) = (short)*(char *)(lVar29 + lVar39)
          ;
          d2[lVar39] = (short)*(char *)(lVar35 + lVar39);
          d3[lVar39] = (short)*(char *)(lVar36 + lVar39);
        }
        for (lVar39 = 0; auVar24 = _t2, auVar23 = _t3, auVar22 = _t1, lVar39 != 8;
            lVar39 = lVar39 + 2) {
          sVar2 = *(short *)((long)d2 + lVar39);
          *(short *)((long)w0 + lVar39) = *(short *)((long)&top_blob_tm.data + lVar39) - sVar2;
          sVar3 = *(short *)((long)&top_blob_bordered.data + lVar39);
          *(short *)((long)w1 + lVar39) = sVar3 + sVar2;
          *(short *)((long)w2 + lVar39) = sVar2 - sVar3;
          *(short *)((long)w3 + lVar39) = *(short *)((long)d3 + lVar39) - sVar3;
        }
        t0[0] = w0[0];
        t0[1] = w1[0];
        t1[1] = w1[1];
        t1[0] = w0[1];
        t2[1] = w1[2];
        t2[0] = w0[2];
        t3[1] = w1[3];
        t3[0] = w0[3];
        t0[2] = w2[0];
        t1[2] = w2[1];
        t2[2] = w2[2];
        t3[2] = w2[3];
        t0[3] = w3[0];
        _iStack_2f0 = auVar22._8_8_;
        t1[3] = w3[1];
        uStack_230 = auVar24._8_8_;
        t2[3] = w3[2];
        uStack_270 = auVar23._8_8_;
        t3[3] = w3[3];
        for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 2) {
          sVar2 = *(short *)((long)t2 + lVar39);
          *(short *)((long)&top_blob_tm.data + lVar39) = *(short *)((long)t0 + lVar39) - sVar2;
          sVar3 = *(short *)((long)t1 + lVar39);
          *(short *)((long)&top_blob_bordered.data + lVar39) = sVar3 + sVar2;
          *(short *)((long)d2 + lVar39) = sVar2 - sVar3;
          *(short *)((long)d3 + lVar39) = *(short *)((long)t3 + lVar39) - sVar3;
        }
        for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 2) {
          *(undefined2 *)((long)pvVar49 + lVar39) =
               *(undefined2 *)((long)&top_blob_tm.data + lVar39);
          *(undefined2 *)((long)pvVar49 + lVar39 + 8) =
               *(undefined2 *)((long)&top_blob_bordered.data + lVar39);
          *(undefined2 *)((long)pvVar49 + lVar39 + 0x10) = *(undefined2 *)((long)d2 + lVar39);
          *(undefined2 *)((long)pvVar49 + lVar39 + 0x18) = *(undefined2 *)((long)d3 + lVar39);
        }
        lVar28 = lVar28 + 2;
        lVar29 = lVar29 + 2;
        lVar35 = lVar35 + 2;
        lVar36 = lVar36 + 2;
        pvVar49 = (void *)((long)pvVar49 + 0x20);
      }
    }
  }
  top_blob_tm.elemsize = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0;
  top_blob_tm.refcount._4_4_ = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.c = 0;
  top_blob_tm.cstep = 0;
  Mat::operator=(&bottom_blob_bordered,&top_blob_tm);
  Mat::~Mat(&top_blob_tm);
  top_blob_tm.elemsize = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0;
  top_blob_tm.refcount._4_4_ = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.c = 0;
  top_blob_tm.cstep = 0;
  Mat::create(&top_blob_tm,0x10,iVar48,_c_00,4,opt->workspace_allocator);
  uVar30 = (long)(int)_c_00 & 0xfffffffffffffffc;
  uVar26 = 0;
  if (iVar48 < 1) {
    iVar48 = 0;
  }
  uVar27 = (ulong)(uint)((int)_c_00 >> 2);
  if ((int)_c_00 >> 2 < 1) {
    uVar27 = uVar26;
  }
  for (; sVar19 = top_blob_tm.elemsize, uVar26 != uVar27; uVar26 = uVar26 + 1) {
    iVar32 = top_blob_tm.w;
    lVar36 = top_blob_tm.cstep * top_blob_tm.elemsize;
    top_blob_bordered.data = (void *)(lVar36 * uVar26 * 4 + (long)top_blob_tm.data);
    top_blob_bordered.refcount._0_4_ = 0;
    top_blob_bordered.refcount._4_4_ = 0;
    top_blob_bordered.elemsize = top_blob_tm.elemsize;
    top_blob_bordered.elempack = top_blob_tm.elempack;
    top_blob_bordered.dims = 2;
    top_blob_bordered.allocator = top_blob_tm.allocator;
    top_blob_bordered.w = top_blob_tm.w;
    lVar31 = uVar26 * 4 + 1;
    d2 = (short  [4])(lVar36 * lVar31 + (long)top_blob_tm.data);
    top_blob_bordered.c = 1;
    top_blob_bordered.h = top_blob_tm.h;
    local_3c0 = top_blob_tm.elemsize;
    local_3a4 = top_blob_tm.w;
    lVar29 = uVar26 * 4 + 2;
    uStack_410 = 0;
    d3 = (short  [4])(lVar36 * lVar29 + (long)top_blob_tm.data);
    lVar35 = uVar26 * 4 + 3;
    w0 = (short  [4])(lVar36 * lVar35 + (long)top_blob_tm.data);
    top_blob_bordered.cstep = (long)(top_blob_tm.h * top_blob_tm.w);
    Mat::channel((Mat *)w1,kernel_tm,(int)(uVar26 * 4));
    Mat::channel((Mat *)w2,kernel_tm,(int)lVar31);
    Mat::channel((Mat *)w3,kernel_tm,(int)lVar29);
    Mat::channel((Mat *)t0,kernel_tm,(int)lVar35);
    for (iVar37 = 0; asVar21 = d2, sVar13 = top_blob_bordered.elemsize,
        pvVar47 = top_blob_bordered.data, asVar18 = w0, iVar37 != iVar48; iVar37 = iVar37 + 1) {
      iVar45 = top_blob_bordered.w;
      asVar20 = d3;
      _t1 = (undefined1  [16])0x0;
      _t2 = (undefined1  [16])0x0;
      _t3 = (undefined1  [16])0x0;
      sum3[0xc] = 0;
      sum3[0xd] = 0;
      sum3[0xe] = 0;
      sum3[0xf] = 0;
      sum3[8] = 0;
      sum3[9] = 0;
      sum3[10] = 0;
      sum3[0xb] = 0;
      sum3[4] = 0;
      sum3[5] = 0;
      sum3[6] = 0;
      sum3[7] = 0;
      sum3[0] = 0;
      sum3[1] = 0;
      sum3[2] = 0;
      sum3[3] = 0;
      local_450 = 1;
      local_420 = 2;
      local_428 = 3;
      for (uVar42 = 0; sVar9 = bottom_blob_tm.elemsize, pvVar49 = bottom_blob_tm.data,
          (long)(uVar42 | 3) < lVar51; uVar42 = uVar42 + 4) {
        iVar34 = bottom_blob_tm.w;
        lVar29 = bottom_blob_tm.cstep * uVar42;
        d3_1 = (int  [2])(lVar29 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)d3_1);
        sVar10 = bottom_blob_tm.elemsize;
        pvVar6 = bottom_blob_tm.data;
        iVar41 = bottom_blob_tm.w;
        sVar15 = bottom_blob_tm.cstep;
        d3_1 = (int  [2])
               ((uVar42 | 1) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
               (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)d3_1);
        sVar11 = bottom_blob_tm.elemsize;
        pvVar7 = bottom_blob_tm.data;
        iVar38 = bottom_blob_tm.w;
        sVar16 = bottom_blob_tm.cstep;
        d3_1 = (int  [2])
               ((uVar42 | 2) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
               (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)d3_1);
        sVar12 = bottom_blob_tm.elemsize;
        pvVar8 = bottom_blob_tm.data;
        iVar14 = bottom_blob_tm.w;
        sVar17 = bottom_blob_tm.cstep;
        d3_1 = (int  [2])
               ((uVar42 | 3) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
               (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)d3_1);
        iVar33 = (int)uVar42;
        lVar31 = (long)(local_28c * iVar33) * local_2a8 +
                 CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0])));
        lVar35 = (long)(local_1cc * iVar33) * local_1e8 +
                 CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0])));
        lVar36 = (long)(local_18c * iVar33) * local_1a8 +
                 CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0])));
        lVar28 = (long)(local_14c * iVar33) * local_168 +
                 CONCAT26(w1[3],CONCAT24(w1[2],CONCAT22(w1[1],w1[0])));
        for (lVar39 = 0; lVar39 != 0x20; lVar39 = lVar39 + 2) {
          iVar33 = (int)*(short *)((long)pvVar49 + lVar39 + (iVar34 * iVar37 + lVar29) * sVar9);
          iVar50 = (int)*(short *)((long)pvVar6 +
                                  lVar39 + ((long)(iVar41 * iVar37) + sVar15 * local_450) * sVar10);
          iVar52 = (int)*(short *)((long)pvVar7 +
                                  lVar39 + ((long)(iVar38 * iVar37) + sVar16 * local_420) * sVar11);
          iVar44 = (int)*(short *)((long)pvVar8 +
                                  lVar39 + ((long)(iVar14 * iVar37) + sVar17 * local_428) * sVar12);
          *(int *)(t1 + lVar39) =
               *(short *)(lVar28 + 0x60 + lVar39) * iVar44 +
               *(short *)(lVar28 + 0x40 + lVar39) * iVar52 +
               *(short *)(lVar28 + 0x20 + lVar39) * iVar50 +
               *(short *)(lVar28 + lVar39) * iVar33 + *(int *)(t1 + lVar39);
          *(int *)(t2 + lVar39) =
               *(short *)(lVar36 + 0x60 + lVar39) * iVar44 +
               *(short *)(lVar36 + 0x40 + lVar39) * iVar52 +
               *(short *)(lVar36 + 0x20 + lVar39) * iVar50 +
               *(short *)(lVar36 + lVar39) * iVar33 + *(int *)(t2 + lVar39);
          *(int *)(t3 + lVar39) =
               *(short *)(lVar35 + 0x60 + lVar39) * iVar44 +
               *(short *)(lVar35 + 0x40 + lVar39) * iVar52 +
               *(short *)(lVar35 + 0x20 + lVar39) * iVar50 +
               *(short *)(lVar35 + lVar39) * iVar33 + *(int *)(t3 + lVar39);
          *(int *)((long)sum3 + lVar39 * 2) =
               *(short *)(lVar31 + 0x60 + lVar39) * iVar44 +
               *(short *)(lVar31 + 0x40 + lVar39) * iVar52 +
               *(short *)(lVar31 + 0x20 + lVar39) * iVar50 +
               *(short *)(lVar31 + lVar39) * iVar33 + *(int *)((long)sum3 + lVar39 * 2);
        }
        local_428 = local_428 + 4;
        local_420 = local_420 + 4;
        local_450 = local_450 + 4;
      }
      for (; sVar9 = bottom_blob_tm.elemsize, pvVar49 = bottom_blob_tm.data, (long)uVar42 < lVar51;
          uVar42 = uVar42 + 1) {
        iVar34 = bottom_blob_tm.w;
        lVar29 = bottom_blob_tm.cstep * uVar42;
        d3_1 = (int  [2])(lVar29 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)d3_1);
        iVar41 = (int)uVar42;
        for (lVar31 = 0; lVar31 != 0x20; lVar31 = lVar31 + 2) {
          iVar38 = (int)*(short *)((long)pvVar49 + lVar31 + (iVar34 * iVar37 + lVar29) * sVar9);
          *(int *)(t1 + lVar31) =
               *(int *)(t1 + lVar31) +
               *(short *)((long)(local_14c * iVar41) * local_168 +
                          CONCAT26(w1[3],CONCAT24(w1[2],CONCAT22(w1[1],w1[0]))) + lVar31) * iVar38;
          *(int *)(t2 + lVar31) =
               *(int *)(t2 + lVar31) +
               *(short *)((long)(local_18c * iVar41) * local_1a8 +
                          CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) + lVar31) * iVar38;
          *(int *)(t3 + lVar31) =
               *(int *)(t3 + lVar31) +
               *(short *)((long)(local_1cc * iVar41) * local_1e8 +
                          CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0]))) + lVar31) * iVar38;
          piVar1 = (int *)((long)sum3 + lVar31 * 2);
          *piVar1 = *piVar1 + *(short *)((long)(local_28c * iVar41) * local_2a8 +
                                         CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0]))) +
                                        lVar31) * iVar38;
        }
      }
      for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 4) {
        *(undefined4 *)((long)pvVar47 + lVar31 + sVar13 * (long)(iVar45 * iVar37)) =
             *(undefined4 *)((long)t1 + lVar31);
        *(undefined4 *)((long)asVar21 + sVar19 * (long)(iVar32 * iVar37) + lVar31) =
             *(undefined4 *)((long)t2 + lVar31);
        *(undefined4 *)((long)asVar20 + sVar19 * (long)(iVar32 * iVar37) + lVar31) =
             *(undefined4 *)((long)t3 + lVar31);
        *(undefined4 *)((long)asVar18 + sVar19 * (long)(iVar32 * iVar37) + lVar31) =
             *(undefined4 *)((long)sum3 + lVar31);
      }
    }
    Mat::~Mat((Mat *)t0);
    Mat::~Mat((Mat *)w3);
    Mat::~Mat((Mat *)w2);
    Mat::~Mat((Mat *)w1);
    Mat::~Mat((Mat *)w0);
    Mat::~Mat((Mat *)d3);
    Mat::~Mat((Mat *)d2);
    Mat::~Mat(&top_blob_bordered);
  }
  for (; (long)uVar30 < (long)(int)_c_00; uVar30 = uVar30 + 1) {
    top_blob_bordered.data =
         (void *)(top_blob_tm.cstep * uVar30 * top_blob_tm.elemsize + (long)top_blob_tm.data);
    top_blob_bordered.refcount._0_4_ = 0;
    top_blob_bordered.refcount._4_4_ = 0;
    top_blob_bordered.elemsize = top_blob_tm.elemsize;
    top_blob_bordered.elempack = top_blob_tm.elempack;
    top_blob_bordered.dims = 2;
    top_blob_bordered.allocator = top_blob_tm.allocator;
    top_blob_bordered.w = top_blob_tm.w;
    top_blob_bordered.c = 1;
    top_blob_bordered.h = top_blob_tm.h;
    top_blob_bordered.cstep = (long)(top_blob_tm.h * top_blob_tm.w);
    Mat::channel((Mat *)d2,kernel_tm,(int)uVar30);
    for (iVar32 = 0; sVar19 = top_blob_bordered.elemsize, pvVar47 = top_blob_bordered.data,
        iVar32 != iVar48; iVar32 = iVar32 + 1) {
      iVar37 = top_blob_bordered.w;
      _d3 = (undefined1  [16])0x0;
      local_5c0 = 1;
      local_578 = 2;
      local_450 = 3;
      for (uVar26 = 0; sVar13 = bottom_blob_tm.elemsize, pvVar49 = bottom_blob_tm.data,
          (long)(uVar26 | 3) < lVar51; uVar26 = uVar26 + 4) {
        iVar45 = bottom_blob_tm.w;
        lVar31 = bottom_blob_tm.cstep * uVar26;
        w0 = (short  [4])(lVar31 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)w0);
        sVar9 = bottom_blob_tm.elemsize;
        pvVar6 = bottom_blob_tm.data;
        iVar34 = bottom_blob_tm.w;
        sVar12 = bottom_blob_tm.cstep;
        w0 = (short  [4])
             ((uVar26 | 1) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
             (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)w0);
        sVar10 = bottom_blob_tm.elemsize;
        pvVar7 = bottom_blob_tm.data;
        iVar41 = bottom_blob_tm.w;
        sVar15 = bottom_blob_tm.cstep;
        w0 = (short  [4])
             ((uVar26 | 2) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
             (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)w0);
        sVar11 = bottom_blob_tm.elemsize;
        pvVar8 = bottom_blob_tm.data;
        iVar38 = bottom_blob_tm.w;
        sVar16 = bottom_blob_tm.cstep;
        w0 = (short  [4])
             ((uVar26 | 3) * bottom_blob_tm.cstep * bottom_blob_tm.elemsize +
             (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)w0);
        for (lVar29 = 0; lVar29 != 0x20; lVar29 = lVar29 + 2) {
          *(int *)(d3 + lVar29) =
               (int)*(short *)((long)(local_3a4 * (int)local_450) * local_3c0 + (long)d2 + lVar29) *
               (int)*(short *)((long)pvVar8 +
                              lVar29 + ((long)(iVar38 * iVar32) + sVar16 * local_450) * sVar11) +
               (int)*(short *)((long)((int)local_578 * local_3a4) * local_3c0 + (long)d2 + lVar29) *
               (int)*(short *)((long)pvVar7 +
                              lVar29 + ((long)(iVar41 * iVar32) + sVar15 * local_578) * sVar10) +
               (int)*(short *)((long)((int)local_5c0 * local_3a4) * local_3c0 + (long)d2 + lVar29) *
               (int)*(short *)((long)pvVar6 +
                              lVar29 + ((long)(iVar34 * iVar32) + sVar12 * local_5c0) * sVar9) +
               (int)*(short *)((long)((int)uVar26 * local_3a4) * local_3c0 + (long)d2 + lVar29) *
               (int)*(short *)((long)pvVar49 + lVar29 + (iVar45 * iVar32 + lVar31) * sVar13) +
               *(int *)(d3 + lVar29);
        }
        local_450 = local_450 + 4;
        local_578 = local_578 + 4;
        local_5c0 = local_5c0 + 4;
      }
      for (; sVar13 = bottom_blob_tm.elemsize, pvVar49 = bottom_blob_tm.data, (long)uVar26 < lVar51;
          uVar26 = uVar26 + 1) {
        iVar45 = bottom_blob_tm.w;
        lVar29 = bottom_blob_tm.cstep * uVar26;
        w0 = (short  [4])(lVar29 * bottom_blob_tm.elemsize + (long)bottom_blob_tm.data);
        Mat::~Mat((Mat *)w0);
        for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 1) {
          *(int *)(d3 + lVar31 * 2) =
               *(int *)(d3 + lVar31 * 2) +
               (int)*(short *)((long)(local_3a4 * (int)uVar26) * local_3c0 + (long)d2 + lVar31 * 2)
               * (int)*(short *)((long)pvVar49 + lVar31 * 2 + (iVar45 * iVar32 + lVar29) * sVar13);
        }
      }
      for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 1) {
        *(undefined4 *)((long)pvVar47 + lVar31 * 4 + sVar19 * (long)(iVar37 * iVar32)) =
             *(undefined4 *)(d3 + lVar31 * 2);
      }
    }
    Mat::~Mat((Mat *)d2);
    Mat::~Mat(&top_blob_bordered);
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  Mat::operator=(&bottom_blob_tm,&top_blob_bordered);
  Mat::~Mat(&top_blob_bordered);
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  Mat::create(&top_blob_bordered,iVar5 * 2,iVar4 * 2,_c_00,4,opt->workspace_allocator);
  uVar26 = 0;
  uVar30 = 0;
  if (0 < (int)_c_00) {
    uVar30 = (ulong)_c_00;
  }
  while( true ) {
    sVar13 = top_blob_bordered.elemsize;
    sVar19 = top_blob_tm.elemsize;
    pvVar47 = top_blob_tm.data;
    iVar4 = top_blob_bordered.w;
    if (uVar26 == uVar30) break;
    iVar32 = top_blob_tm.w;
    lVar31 = top_blob_tm.cstep * uVar26;
    d2 = (short  [4])(lVar31 * top_blob_tm.elemsize + (long)top_blob_tm.data);
    pvVar49 = (void *)(top_blob_bordered.cstep * uVar26 * top_blob_bordered.elemsize +
                      (long)top_blob_bordered.data);
    uStack_410 = 0;
    d3 = (short  [4])pvVar49;
    iVar48 = 0;
    for (iVar37 = 0; local_300 = (int)uVar46, iVar37 != local_300; iVar37 = iVar37 + 1) {
      puVar40 = (undefined8 *)((long)(iVar37 * 2 * iVar4) * sVar13 + (long)pvVar49);
      puVar43 = (undefined8 *)((long)((iVar37 * 2 + 1) * iVar4) * sVar13 + (long)pvVar49);
      iVar45 = iVar48;
      for (iVar34 = 0; iVar34 != iVar25; iVar34 = iVar34 + 1) {
        lVar51 = (iVar32 * iVar45 + lVar31) * sVar19;
        for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 4) {
          *(undefined4 *)((long)w0 + lVar29) = *(undefined4 *)((long)pvVar47 + lVar29 + lVar51);
          *(undefined4 *)((long)w1 + lVar29) =
               *(undefined4 *)((long)pvVar47 + lVar29 + lVar51 + 0x10);
          *(undefined4 *)((long)w2 + lVar29) =
               *(undefined4 *)((long)pvVar47 + lVar29 + lVar51 + 0x20);
          *(undefined4 *)((long)w3 + lVar29) =
               *(undefined4 *)((long)pvVar47 + lVar29 + lVar51 + 0x30);
        }
        for (lVar51 = 0; auVar24 = _t2, auVar23 = _t3, auVar22 = _t1, lVar51 != 0x10;
            lVar51 = lVar51 + 4) {
          *(int *)((long)t0 + lVar51) =
               *(int *)((long)w0 + lVar51) + *(int *)((long)w1 + lVar51) +
               *(int *)((long)w2 + lVar51);
          *(int *)((long)t1 + lVar51) =
               (*(int *)((long)w1 + lVar51) - *(int *)((long)w2 + lVar51)) +
               *(int *)((long)w3 + lVar51);
        }
        t2[1] = t0[1];
        t2[0] = t0[0];
        t3[1] = t0[3];
        t3[0] = t0[2];
        uStack_230 = auVar24._8_8_;
        t2[2] = t1[0];
        t2[3] = t1[1];
        uStack_270 = auVar23._8_8_;
        t3[2] = t1[2];
        t3[3] = t1[3];
        iStack_2f0 = auVar22._8_4_;
        sum3[1] = iStack_2f0;
        sum3[0] = local_2b0;
        iStack_2ec = auVar22._12_4_;
        d3_1[1] = iStack_2ec;
        d3_1[0] = local_2ac;
        for (lVar51 = 0; lVar51 != 8; lVar51 = lVar51 + 4) {
          *(int *)((long)o0 + lVar51) =
               *(int *)((long)t2 + lVar51) + *(int *)((long)t3 + lVar51) +
               *(int *)((long)sum3 + lVar51);
          *(int *)((long)o1 + lVar51) =
               (*(int *)((long)t3 + lVar51) - *(int *)((long)sum3 + lVar51)) +
               *(int *)((long)d3_1 + lVar51);
        }
        *puVar40 = CONCAT44(o0[1] >> 2,o0[0] >> 2);
        *puVar43 = CONCAT44(o1[1] >> 2,o1[0] >> 2);
        puVar40 = puVar40 + 1;
        puVar43 = puVar43 + 1;
        iVar45 = iVar45 + 1;
        _t1 = auVar22;
      }
      iVar48 = iVar48 + iVar5;
    }
    Mat::~Mat((Mat *)d3);
    Mat::~Mat((Mat *)d2);
    uVar26 = uVar26 + 1;
  }
  copy_cut_border(&top_blob_bordered,top_blob,0,top_blob_bordered.h - top_blob->h,0,
                  top_blob_bordered.w - top_blob->w,opt);
  Mat::~Mat(&top_blob_bordered);
  Mat::~Mat(&top_blob_tm);
  Mat::~Mat(&bottom_blob_tm);
  Mat::~Mat(&bottom_blob_bordered);
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4*4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4],d1[4],d2[4],d3[4];
                    short w0[4],w1[4],w2[4],w3[4];
                    short t0[4],t1[4],t2[4],t3[4];
                    // load 
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }                                  
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {   
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }                                
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {   
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }                
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 4] = d1[n];
                        out_tm0[n+ 8] = d2[n];
                        out_tm0[n+12] = d3[n];
                    }                  

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();
    
    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p+1);
            Mat out2_tm = top_blob_tm.channel(p+2);
            Mat out3_tm = top_blob_tm.channel(p+3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p+1);
            const Mat kernel2_tm = kernel_tm.channel(p+2);
            const Mat kernel3_tm = kernel_tm.channel(p+3);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q+1);
                    const short* k2 = kernel0_tm.row<short>(q+2);
                    const short* k3 = kernel0_tm.row<short>(q+3);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }             
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot    

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // }; 

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*2);
                int* outRow1 = out.row<int>(j*2+1);

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[4],s1[4],s2[4],s3[4];
                    int w0[4],w1[4];
                    int d0[2],d1[2],d2[2],d3[2];
                    int o0[2],o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 4];
                        s2[n] = out_tile[n+ 8];
                        s3[n] = out_tile[n+12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0];
                        d1[0] = w0[1]; d1[1] = w1[1];
                        d2[0] = w0[2]; d2[1] = w1[2];
                        d3[0] = w0[3]; d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;           
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}